

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_pow(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  numeric *pnVar2;
  undefined8 uVar3;
  pointer_____offset_0x10___ *this_00;
  proxy *in_RDI;
  unkbyte10 in_ST1;
  double __x;
  double in_XMM1_Qa;
  string *in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff22;
  type_info *in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff30;
  undefined2 uVar4;
  undefined6 in_stack_ffffffffffffff32;
  allocator local_79;
  string local_78 [24];
  any *in_stack_ffffffffffffffa0;
  longdouble local_58;
  numeric local_48 [2];
  
  cs_impl::any::type((any *)CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20));
  bVar1 = std::type_info::operator==
                    ((type_info *)CONCAT62(in_stack_ffffffffffffff32,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28);
  if (bVar1) {
    cs_impl::any::type((any *)CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20));
    this_00 = &numeric::typeinfo;
    bVar1 = std::type_info::operator==
                      ((type_info *)CONCAT62(in_stack_ffffffffffffff32,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff28);
    if (bVar1) {
      pnVar2 = cs_impl::any::const_val<cs::numeric>(in_stack_ffffffffffffffa0);
      numeric::as_float((numeric_float *)pnVar2,(numeric *)this_00);
      pnVar2 = cs_impl::any::const_val<cs::numeric>(in_stack_ffffffffffffffa0);
      numeric::as_float((numeric_float *)pnVar2,(numeric *)this_00);
      pnVar2 = (numeric *)in_ST1;
      uVar4 = (undefined2)((unkuint10)in_ST1 >> 0x40);
      std::pow(__x,in_XMM1_Qa);
      numeric::numeric<long_double>(local_48,&local_58);
      cs_impl::any::any<cs::numeric>((any *)CONCAT62(in_stack_ffffffffffffff32,uVar4),pnVar2);
      return (var)in_RDI;
    }
  }
  uVar3 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Unsupported operator operations(Pow).",&local_79);
  runtime_error::runtime_error
            ((runtime_error *)CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_pow(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return numeric(std::pow(a.const_val<numeric>().as_float(), b.const_val<numeric>().as_float()));
		else
			throw runtime_error("Unsupported operator operations(Pow).");
	}